

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sampler.cpp
# Opt level: O0

Vector2 __thiscall pm::Sampler::sampleUnitDisk(Sampler *this,unsigned_long *count,int *jump)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  uint32_t uVar4;
  reference pvVar5;
  reference other;
  int *in_RCX;
  Vector2 extraout_XMM0_Qa;
  int *jump_local;
  unsigned_long *count_local;
  Sampler *this_local;
  
  if (*(ulong *)jump % (ulong)*(uint *)((long)count + 0xc) == 0) {
    uVar4 = Random::integer((Random *)(count + 0xf),0,(uint32_t)count[2]);
    *in_RCX = uVar4 * *(int *)((long)count + 0xc);
  }
  iVar1 = *in_RCX;
  iVar2 = *in_RCX;
  uVar3 = *(ulong *)jump;
  *(ulong *)jump = uVar3 + 1;
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(count + 0xc),
                      (long)iVar2 + uVar3 % (ulong)*(uint *)((long)count + 0xc));
  other = std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::operator[]
                    ((vector<pm::Vector2,_std::allocator<pm::Vector2>_> *)(count + 6),
                     (ulong)(iVar1 + *pvVar5));
  Vector2::Vector2((Vector2 *)this,other);
  return extraout_XMM0_Qa;
}

Assistant:

Vector2 Sampler::sampleUnitDisk(unsigned long &count, int &jump)
{
	// Start of a new pixel
	if (count % numSamples_ == 0)
		jump = rnd_.integer(0, numSets_) * numSamples_;

	return diskSamples_[jump + shuffledIndices_[jump + count++ % numSamples_]];
}